

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_thread.cpp
# Opt level: O2

void __thiscall zmq::io_thread_t::in_event(io_thread_t *this)

{
  int __errnum;
  ssize_t sVar1;
  int *piVar2;
  char *errmsg_;
  size_t in_RCX;
  undefined8 in_R8;
  command_t cmd;
  command_t local_c0 [2];
  
  do {
    while( true ) {
      sVar1 = mailbox_t::recv(&this->_mailbox,(int)local_c0,(void *)0x0,in_RCX,(int)in_R8);
      if ((int)sVar1 != 0) break;
      object_t::process_command(local_c0[0].destination,local_c0);
    }
    piVar2 = __errno_location();
    __errnum = *piVar2;
  } while (__errnum == 4);
  if (__errnum != 0xb) {
    errmsg_ = strerror(__errnum);
    fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/io_thread.cpp"
            ,0x5f);
    fflush(_stderr);
    zmq_abort(errmsg_);
  }
  return;
}

Assistant:

void zmq::io_thread_t::in_event ()
{
    //  TODO: Do we want to limit number of commands I/O thread can
    //  process in a single go?

    command_t cmd;
    int rc = _mailbox.recv (&cmd, 0);

    while (rc == 0 || errno == EINTR) {
        if (rc == 0)
            cmd.destination->process_command (cmd);
        rc = _mailbox.recv (&cmd, 0);
    }

    errno_assert (rc != 0 && errno == EAGAIN);
}